

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O0

void __thiscall Activation::TracePointers(Activation *this,function<void_(Sexp_**)> *func)

{
  Sexp **ppSVar1;
  size_type sVar2;
  ulong local_28;
  size_t i;
  Sexp **data;
  function<void_(Sexp_**)> *func_local;
  Activation *this_local;
  
  ppSVar1 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::data(&this->slots);
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::size(&this->slots);
    if (sVar2 <= local_28) break;
    if (ppSVar1[local_28] != (Sexp *)0x0) {
      std::function<void_(Sexp_**)>::operator()(func,ppSVar1 + local_28);
    }
    local_28 = local_28 + 1;
  }
  if (this->parent != (Sexp *)0x0) {
    std::function<void_(Sexp_**)>::operator()(func,&this->parent);
  }
  return;
}

Assistant:

void Activation::TracePointers(std::function<void(Sexp **)> func) {
  Sexp **data = slots.data();
  for (size_t i = 0; i < slots.size(); i++) {
    if (data[i] != nullptr) {
      func(&data[i]);
    }
  }

  if (parent != nullptr) {
    func(&parent);
  }
}